

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_info.c
# Opt level: O0

MPP_RET hal_info_get(HalInfo ctx,MppDevInfoCfg *data,RK_S32 *size)

{
  uint uVar1;
  undefined8 in_R9;
  int local_44;
  int iVar2;
  RK_S32 i;
  RK_S32 type_max;
  RK_S32 out_size;
  RK_S32 elem_size;
  RK_S32 max_size;
  HalInfoImpl *info;
  RK_S32 *size_local;
  MppDevInfoCfg *data_local;
  HalInfo ctx_local;
  
  if (ctx == (HalInfo)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL input ctx\n","hal_info_get");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if (((data == (MppDevInfoCfg *)0x0) || (size == (RK_S32 *)0x0)) || (*size == 0)) {
    _mpp_log_l(2,(char *)0x0,"found invalid output cfg data %p size %p\n","hal_info_get",data,size);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if (*(int *)((long)ctx + 8) == 0) {
    *size = 0;
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    uVar1 = *size;
    i = 0;
    iVar2 = *ctx;
    if (iVar2 == 0) {
      iVar2 = 6;
    }
    else {
      if (iVar2 != 1) {
        _mpp_log_l(2,(char *)0x0,"found invalid ctx type %d\n","hal_info_get",(ulong)*ctx,in_R9,
                   iVar2,0);
        return MPP_ERR_VALUE;
      }
      iVar2 = 0xb;
    }
    size_local = (RK_S32 *)data;
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      if ((*(uint *)((long)ctx + 8) & 1 << ((byte)local_44 & 0x1f)) != 0) {
        if ((int)uVar1 < i + 0x10) {
          _mpp_log_l(2,(char *)0x0,"out data size %d is too small for %d\n","hal_info_get",
                     (ulong)uVar1,(ulong)(i + 0x10));
          break;
        }
        memcpy(size_local,(void *)(*(long *)((long)ctx + 0x10) + (long)local_44 * 0x10),0x10);
        size_local = size_local + 4;
        i = i + 0x10;
        *(uint *)((long)ctx + 8) =
             (1 << ((byte)local_44 & 0x1f) ^ 0xffffffffU) & *(uint *)((long)ctx + 8);
      }
    }
    *size = i;
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET hal_info_get(HalInfo ctx, MppDevInfoCfg *data, RK_S32 *size)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    if (NULL == data || NULL == size || *size == 0) {
        mpp_err_f("found invalid output cfg data %p size %p\n", data, size);
        return MPP_ERR_NULL_PTR;
    }

    HalInfoImpl *info = (HalInfoImpl *)ctx;
    if (!info->updated) {
        *size = 0;
        return MPP_OK;
    }

    RK_S32 max_size = *size;
    RK_S32 elem_size = sizeof(info->elems[0]);
    RK_S32 out_size = 0;
    RK_S32 type_max = 0;
    RK_S32 i;

    switch (info->type) {
    case MPP_CTX_DEC : {
        type_max = DEC_INFO_BUTT - DEC_INFO_BASE;
    } break;
    case MPP_CTX_ENC : {
        type_max = ENC_INFO_BUTT - ENC_INFO_BASE;
    } break;
    default : {
        mpp_err_f("found invalid ctx type %d\n", info->type);
        return MPP_ERR_VALUE;
    } break;
    }

    for (i = 0; i < type_max; i++) {
        if (!(info->updated & (1 << i)))
            continue;

        if (out_size + elem_size > max_size) {
            mpp_err_f("out data size %d is too small for %d\n",
                      max_size, out_size + elem_size);
            break;
        }

        memcpy(data, &info->elems[i], elem_size);
        data++;
        out_size += elem_size;
        info->updated &= ~(1 << i);
    }

    *size = out_size;
    return MPP_OK;
}